

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O1

void __thiscall CfgNode::BlockData::addInstruction(BlockData *this,Instruction *instr)

{
  size_t *psVar1;
  int iVar2;
  _List_node_base *p_Var3;
  
  if ((instr != (Instruction *)0x0) && (0 < instr->m_size)) {
    if ((this->m_instrs).super__List_base<Instruction_*,_std::allocator<Instruction_*>_>._M_impl.
        _M_node.super__List_node_base._M_next == (_List_node_base *)&this->m_instrs) {
      if (instr->m_addr != (this->super_Data).m_addr) {
        __assert_fail("instr->addr() == m_addr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CfgNode.cpp"
                      ,0x6c,"void CfgNode::BlockData::addInstruction(Instruction *)");
      }
    }
    else {
      p_Var3 = (this->m_instrs).super__List_base<Instruction_*,_std::allocator<Instruction_*>_>.
               _M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
      if (instr->m_addr != (long)&p_Var3->_M_prev->_M_next + (long)*(int *)&p_Var3[1]._M_next) {
        __assert_fail("instr->addr() == (prev->addr() + prev->size())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CfgNode.cpp"
                      ,0x70,"void CfgNode::BlockData::addInstruction(Instruction *)");
      }
    }
    p_Var3 = (_List_node_base *)operator_new(0x18);
    p_Var3[1]._M_next = (_List_node_base *)instr;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar1 = &(this->m_instrs).super__List_base<Instruction_*,_std::allocator<Instruction_*>_>.
              _M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    iVar2 = ((int)instr->m_addr + instr->m_size) - (int)(this->super_Data).m_addr;
    if (this->m_size < iVar2) {
      this->m_size = iVar2;
    }
    return;
  }
  __assert_fail("instr != 0 && instr->size() > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CfgNode.cpp"
                ,0x69,"void CfgNode::BlockData::addInstruction(Instruction *)");
}

Assistant:

void CfgNode::BlockData::addInstruction(Instruction* instr) {
	assert(instr != 0 && instr->size() > 0);

	if (m_instrs.empty()) {
		assert(instr->addr() == m_addr);
		m_instrs.push_back(instr);
	} else {
		Instruction* prev = m_instrs.back();
		assert(instr->addr() == (prev->addr() + prev->size()));
		m_instrs.push_back(instr);
	}

	int size = (instr->addr() + instr->size()) - m_addr;
	if (size > m_size)
		m_size = size;
}